

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hnsw.hpp
# Opt level: O2

void __thiscall hnsw::HNSWIndex::SaveIndex(HNSWIndex *this,char *filename)

{
  pointer pVVar1;
  pointer ppVar2;
  HNSWIndex *pHVar3;
  pointer ppVar4;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *__range4
  ;
  pointer pvVar5;
  uint local_278;
  index_t num_neighbors;
  char *local_270;
  HNSWIndex *local_268;
  uint32_t *local_260;
  pointer local_258;
  pair<unsigned_int,_float> p;
  vector<unsigned_int,_std::allocator<unsigned_int>_> edges;
  ofstream os;
  
  local_270 = filename;
  std::ofstream::ofstream(&os,filename,_S_out|_S_bin);
  local_260 = &this->num_points_;
  std::ostream::write((char *)&os,(long)local_260);
  local_268 = this;
  for (local_278 = 0; pHVar3 = local_268, local_278 < *local_260; local_278 = local_278 + 1) {
    std::ostream::write((char *)&os,(long)&local_278);
    std::ostream::write((char *)&os,
                        (long)&(pHVar3->vertices_).
                               super__Vector_base<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>
                               ._M_impl.super__Vector_impl_data._M_start[local_278].layer);
    pVVar1 = (pHVar3->vertices_).
             super__Vector_base<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_258 = *(pointer *)
                 ((long)&pVVar1[local_278].neighbors.
                         super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                         ._M_impl + 8);
    for (pvVar5 = *(pointer *)
                   &pVVar1[local_278].neighbors.
                    super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                    ._M_impl; pvVar5 != local_258; pvVar5 = pvVar5 + 1) {
      edges.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      edges.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      edges.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      num_neighbors =
           (index_t)((ulong)((long)*(pointer *)
                                    ((long)&(pvVar5->
                                            super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                            )._M_impl.super__Vector_impl_data + 8) -
                            *(long *)&(pvVar5->
                                      super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                      )._M_impl.super__Vector_impl_data) >> 3);
      ppVar2 = *(pointer *)
                ((long)&(pvVar5->
                        super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                        )._M_impl.super__Vector_impl_data + 8);
      for (ppVar4 = (pvVar5->
                    super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar2;
          ppVar4 = ppVar4 + 1) {
        p = *ppVar4;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &edges.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,&p.first);
      }
      std::ostream::write((char *)&os,(long)&num_neighbors);
      std::ostream::write((char *)&os,
                          (long)edges.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&edges.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    }
  }
  std::ofstream::close();
  printf("Saved index to %s\n",local_270);
  std::ofstream::~ofstream(&os);
  return;
}

Assistant:

void SaveIndex(const char *filename) {
    std::ofstream os(filename, std::ios::binary | std::ios::out);
    os.write((char *)&num_points_, sizeof(index_t));

    for (index_t i = 0; i < num_points_; i++) {
      os.write((char *)&i, sizeof(index_t));
      os.write((char *)&vertices_[i].layer, sizeof(layer_t));
      for (const auto &neighbors : vertices_[i].neighbors) {
        index_t num_neighbors = neighbors.size();
        std::vector<index_t> edges;
        for (const auto p : neighbors) {
          edges.push_back(p.first);
        }
        os.write((char *)&num_neighbors, sizeof(index_t));
        os.write((char *)edges.data(), sizeof(index_t) * num_neighbors);
      }
    }
    os.close();
    printf("Saved index to %s\n", filename);
  }